

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QStringList * __thiscall
MakefileGenerator::fileFixify
          (QStringList *__return_storage_ptr__,MakefileGenerator *this,QStringList *files,
          FileFixifyTypes fix,bool canon)

{
  Data *pDVar1;
  QString *file;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((files->d).size == 0) {
    pDVar1 = (files->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (files->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if ((files->d).size != 0) {
      file = (files->d).ptr;
      do {
        if ((file->d).size != 0) {
          fileFixify(&local_50,this,file,fix,canon);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_50);
          QList<QString>::end(__return_storage_ptr__);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        file = file + 1;
      } while (file != (files->d).ptr + (files->d).size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList
MakefileGenerator::fileFixify(const QStringList &files, FileFixifyTypes fix, bool canon) const
{
    if(files.isEmpty())
        return files;
    QStringList ret;
    for(QStringList::ConstIterator it = files.begin(); it != files.end(); ++it) {
        if(!(*it).isEmpty())
            ret << fileFixify((*it), fix, canon);
    }
    return ret;
}